

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFLTKWrapUICommand.cxx
# Opt level: O3

bool cmFLTKWrapUICommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *args,cmExecutionStatus *status)

{
  cmMakefile *this;
  pointer pcVar1;
  _Head_base<0UL,_cmCustomCommand_*,_false> _Var2;
  _Alloc_hider _Var3;
  undefined8 uVar4;
  pointer pbVar5;
  bool bVar6;
  string *psVar7;
  string *psVar8;
  cmSourceFile *this_00;
  cmCustomCommand *this_01;
  undefined8 uVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> ilist;
  string_view value;
  __single_object hcc;
  string sourceListValue;
  __single_object ccc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  outputDirectories;
  string cxxres;
  string varName;
  string outputDirectory;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> generatedSourcesClasses;
  string cdir;
  string outName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  cmCustomCommandLines commandLines;
  _Head_base<0UL,_cmCustomCommand_*,_false> local_258;
  undefined1 local_250 [32];
  _Head_base<0UL,_cmCustomCommand_*,_false> local_230;
  _Any_data local_228;
  undefined1 local_218 [16];
  _Alloc_hider local_208;
  pointer pbStack_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  _Alloc_hider local_1e8;
  char *local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  cmCustomCommand *local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c0;
  string local_1b8;
  string local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  _Alloc_hider local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_140;
  undefined1 local_138 [24];
  undefined1 local_120 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  pointer local_100;
  _Head_base<0UL,_cmCustomCommand_*,_false> local_f8;
  _Head_base<0UL,_cmCustomCommand_*,_false> local_f0;
  undefined1 local_e8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  undefined8 local_98;
  ulong local_90;
  pointer local_88;
  pointer local_80;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_78;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  uVar14 = (long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
  if (uVar14 < 0x21) {
    local_228._M_unused._M_object =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)local_218;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_228,"called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    local_138._8_8_ = local_218._0_8_;
    uVar9 = local_228._M_unused._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_unused._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218) goto LAB_001c7755;
  }
  else {
    this = status->Makefile;
    local_90 = uVar14;
    psVar7 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this);
    local_140 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_138 + 8);
    pcVar1 = (psVar7->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_140,pcVar1,pcVar1 + psVar7->_M_string_length);
    local_228._M_unused._M_object = local_218;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"FLTK_FLUID_EXECUTABLE","")
    ;
    psVar7 = cmMakefile::GetRequiredDefinition(this,(string *)&local_228);
    if ((undefined1 *)local_228._M_unused._0_8_ != local_218) {
      operator_delete(local_228._M_unused._M_object,(ulong)(local_218._0_8_ + 1));
    }
    local_88 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    psVar8 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this);
    local_178._M_allocated_capacity = (size_type)&local_168;
    pcVar1 = (psVar8->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_178,pcVar1,pcVar1 + psVar8->_M_string_length);
    local_228._M_unused._M_object = (cmSourceFile *)0x0;
    local_228._8_8_ = 0;
    local_218._0_8_ = (cmMakefile *)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_228,(value_type *)&local_178);
    cmMakefile::AddIncludeDirectories
              (this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_228,false);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_228);
    local_158._M_allocated_capacity = 0;
    local_158._8_8_ = (cmSourceFile **)0x0;
    local_148._M_p = (pointer)0x0;
    local_80 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    psVar8 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 1;
    if (psVar8 == local_80) {
      local_250._0_8_ = local_250 + 0x10;
      local_250._8_8_ = (code *)0x0;
      local_250[0x10] = '\0';
      local_100 = (pointer)local_250._0_8_;
    }
    else {
      local_100 = (pointer)(local_250 + 0x10);
      do {
        this_00 = cmMakefile::GetSource(this,psVar8,Ambiguous);
        if (this_00 == (cmSourceFile *)0x0) {
LAB_001c6e8a:
          uVar4 = local_178._8_8_;
          uVar9 = local_178._M_allocated_capacity;
          cmsys::SystemTools::GetFilenameWithoutExtension((string *)local_250,psVar8);
          local_228._M_unused._M_object = (void *)uVar4;
          local_228._8_8_ = uVar9;
          local_218._0_8_ = (cmMakefile *)0x1;
          local_218._8_8_ = (long)"in Json::Value::setComment(): Comments must start with /" + 0x37;
          local_208._M_p = (pointer)local_250._8_8_;
          pbStack_200 = (pointer)local_250._0_8_;
          views._M_len = 3;
          views._M_array = (iterator)&local_228;
          cmCatViews_abi_cxx11_((string *)local_120,views);
          if ((pointer)local_250._0_8_ != (pointer)(local_250 + 0x10)) {
            operator_delete((void *)local_250._0_8_,CONCAT71(local_250._17_7_,local_250[0x10]) + 1);
          }
          local_228._M_unused._M_object = (void *)local_120._8_8_;
          local_228._8_8_ = local_120._0_8_;
          local_218._0_8_ = (cmMakefile *)0x2;
          local_218._8_8_ = (long)".objc.h" + 5;
          views_00._M_len = 2;
          views_00._M_array = (iterator)&local_228;
          cmCatViews_abi_cxx11_((string *)local_250,views_00);
          local_228._M_unused._M_object = (void *)local_138._0_8_;
          local_228._8_8_ = local_140;
          local_218._0_8_ = (cmMakefile *)0x1;
          local_218._8_8_ = (long)"in Json::Value::setComment(): Comments must start with /" + 0x37;
          pbStack_200 = (pointer)(psVar8->_M_dataplus)._M_p;
          local_208._M_p = (pointer)psVar8->_M_string_length;
          views_01._M_len = 3;
          views_01._M_array = (iterator)&local_228;
          cmCatViews_abi_cxx11_(&local_198,views_01);
          local_a8._M_allocated_capacity = 0;
          local_a8._8_8_ = 0;
          local_98 = 0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_a8,&local_198);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_a8,psVar7);
          local_228._M_unused._M_object = (void *)local_120._8_8_;
          local_228._8_8_ = local_120._0_8_;
          local_218._0_8_ = (cmMakefile *)0x4;
          local_218._8_8_ =
               (long)
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmLocalUnixMakefileGenerator3.cxx"
               + 0x6d;
          views_02._M_len = 2;
          views_02._M_array = (iterator)&local_228;
          cmCatViews_abi_cxx11_(&local_1b8,views_02);
          local_228._8_8_ = (psVar7->_M_dataplus)._M_p;
          local_228._M_unused._0_8_ = (undefined8)psVar7->_M_string_length;
          local_218._0_8_ = (cmMakefile *)0x2;
          local_218._8_8_ = (long)"linux-c" + 5;
          local_208._M_p = (pointer)0x2;
          pbStack_200 = (pointer)0x6821cf;
          local_1f8._M_allocated_capacity = local_250._8_8_;
          local_1f8._8_8_ = local_250._0_8_;
          local_1e8._M_p = (pointer)0x2;
          local_1e0 = "-o";
          local_1d8._M_allocated_capacity = local_1b8._M_string_length;
          local_1d8._8_8_ = local_1b8._M_dataplus._M_p;
          local_1c8 = (cmCustomCommand *)local_198._M_string_length;
          local_1c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_198._M_dataplus._M_p;
          ilist._M_len = 7;
          ilist._M_array = (iterator)&local_228;
          cmMakeSingleCommandLine((cmCustomCommandLines *)&local_78,ilist);
          std::make_unique<cmCustomCommand>();
          _Var2._M_head_impl = local_258._M_head_impl;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_48,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_a8);
          cmCustomCommand::SetDepends(_Var2._M_head_impl,&local_48);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_48);
          _Var2._M_head_impl = local_258._M_head_impl;
          std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::vector
                    (&local_60,&local_78);
          cmCustomCommand::SetCommandLines(_Var2._M_head_impl,(cmCustomCommandLines *)&local_60);
          std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_60)
          ;
          _Var2._M_head_impl = local_258._M_head_impl;
          this_01 = (cmCustomCommand *)operator_new(0x138);
          cmCustomCommand::cmCustomCommand(this_01,_Var2._M_head_impl);
          _Var2._M_head_impl = local_258._M_head_impl;
          local_c8._M_allocated_capacity = (size_type)&local_b8;
          local_230._M_head_impl = this_01;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_c8,local_1b8._M_dataplus._M_p,
                     (long)(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)local_1b8._M_dataplus._M_p + local_1b8._M_string_length);
          cmCustomCommand::SetOutputs(_Var2._M_head_impl,(string *)&local_c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_allocated_capacity != &local_b8) {
            operator_delete((void *)local_c8._M_allocated_capacity,
                            (ulong)(local_b8._M_allocated_capacity + 1));
          }
          local_f0._M_head_impl = local_258._M_head_impl;
          local_258._M_head_impl = (cmCustomCommand *)0x0;
          local_218._0_8_ = (cmMakefile *)0x0;
          local_218[8] = false;
          local_218[9] = false;
          local_218._10_6_ = 0;
          local_228._M_unused._M_object = (void *)0x0;
          local_228._8_8_ = 0;
          cmMakefile::AddCustomCommandToOutput
                    (this,(unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                          &local_f0,(CommandSourceCallback *)&local_228,false);
          if ((cmMakefile *)local_218._0_8_ != (cmMakefile *)0x0) {
            (*(code *)local_218._0_8_)(&local_228,&local_228,3);
          }
          std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                    ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&local_f0
                    );
          _Var2._M_head_impl = local_230._M_head_impl;
          local_e8._0_8_ = local_e8 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_e8,local_250._0_8_,(code *)(local_250._8_8_ + local_250._0_8_))
          ;
          cmCustomCommand::SetOutputs(_Var2._M_head_impl,(string *)local_e8);
          if ((pointer)local_e8._0_8_ != (pointer)(local_e8 + 0x10)) {
            operator_delete((void *)local_e8._0_8_,(ulong)(local_e8._16_8_ + 1));
          }
          local_f8._M_head_impl = local_230._M_head_impl;
          local_230._M_head_impl = (cmCustomCommand *)0x0;
          local_218._0_8_ = (cmMakefile *)0x0;
          local_218._8_8_ = (code *)0x0;
          local_228._M_unused._M_object = (void *)0x0;
          local_228._8_8_ = 0;
          cmMakefile::AddCustomCommandToOutput
                    (this,(unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                          &local_f8,(CommandSourceCallback *)&local_228,false);
          if ((cmMakefile *)local_218._0_8_ != (cmMakefile *)0x0) {
            (*(code *)local_218._0_8_)(&local_228,&local_228,3);
          }
          std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                    ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&local_f8
                    );
          local_228._M_unused._M_object = cmMakefile::GetSource(this,&local_1b8,Ambiguous);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&((cmSourceFile *)local_228._M_unused._0_8_)->Depends,(value_type *)local_250)
          ;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(local_228._M_unused._M_function_pointer + 0x110),&local_198);
          if ((pointer)local_158._8_8_ == local_148._M_p) {
            std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>::
            _M_realloc_insert<cmSourceFile*const&>
                      ((vector<cmSourceFile*,std::allocator<cmSourceFile*>> *)local_158._M_local_buf
                       ,(iterator)local_158._8_8_,(cmSourceFile **)&local_228);
          }
          else {
            *(void **)local_158._8_8_ = local_228._M_unused._M_object;
            local_158._8_8_ = local_158._8_8_ + 8;
          }
          std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                    ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                     &local_230);
          std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                    ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                     &local_258);
          std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_78)
          ;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
            operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) {
            operator_delete(local_198._M_dataplus._M_p,
                            (ulong)(local_198.field_2._M_allocated_capacity + 1));
          }
          if ((pointer)local_250._0_8_ != (pointer)(local_250 + 0x10)) {
            operator_delete((void *)local_250._0_8_,CONCAT71(local_250._17_7_,local_250[0x10]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._0_8_ != &local_110) {
            operator_delete((void *)local_120._0_8_,(ulong)(local_110._0_8_ + 1));
          }
        }
        else {
          local_228._M_unused._M_object = local_218;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"WRAP_EXCLUDE","");
          bVar6 = cmSourceFile::GetPropertyAsBool(this_00,(string *)&local_228);
          if ((cmSourceFile *)local_228._M_unused._0_8_ != (cmSourceFile *)local_218) {
            operator_delete(local_228._M_unused._M_object,(ulong)(local_218._0_8_ + 1));
          }
          if (!bVar6) goto LAB_001c6e8a;
        }
        psVar8 = psVar8 + 1;
      } while (psVar8 != local_80);
      local_250._0_8_ = local_250 + 0x10;
      local_250._8_8_ = (code *)0x0;
      local_250[0x10] = '\0';
      if (local_158._8_8_ - local_158._0_8_ != 0) {
        lVar12 = (long)(local_158._8_8_ - local_158._0_8_) >> 3;
        lVar13 = 0;
        lVar11 = 0;
        do {
          uVar9 = local_158._M_allocated_capacity;
          if (lVar11 != 0) {
            std::__cxx11::string::append(local_250);
            uVar9 = (undefined8 *)(local_158._M_allocated_capacity + lVar13);
          }
          psVar7 = cmSourceFile::ResolveFullPath
                             (*(cmSourceFile **)uVar9,(string *)0x0,(string *)0x0);
          std::__cxx11::string::_M_append(local_250,(ulong)(psVar7->_M_dataplus)._M_p);
          lVar11 = lVar11 + 1;
          lVar13 = lVar13 + 8;
        } while (lVar12 + (ulong)(lVar12 == 0) != lVar11);
      }
    }
    pbVar5 = local_88;
    pcVar1 = (local_88->_M_dataplus)._M_p;
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_198,pcVar1,pcVar1 + local_88->_M_string_length);
    std::__cxx11::string::append((char *)&local_198);
    value._M_str = (char *)local_250._0_8_;
    value._M_len = local_250._8_8_;
    cmMakefile::AddDefinition(this,&local_198,value);
    pcVar1 = (pbVar5->_M_dataplus)._M_p;
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1b8,pcVar1,pcVar1 + pbVar5->_M_string_length);
    _Var3._M_p = local_1b8._M_dataplus._M_p;
    local_120._8_8_ = 0;
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)operator_new(0x20);
    paVar10->_M_allocated_capacity = (size_type)(paVar10->_M_local_buf + 0x10);
    std::__cxx11::string::_M_construct<char*>
              ((string *)paVar10,_Var3._M_p,
               (long)(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)_Var3._M_p + local_1b8._M_string_length);
    local_218._8_8_ =
         std::
         _Function_handler<void_(cmLocalGenerator_&,_const_cmListFileBacktrace_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmFLTKWrapUICommand.cxx:134:5)>
         ::_M_invoke;
    local_228._8_8_ = local_120._8_8_;
    local_218._0_8_ =
         std::
         _Function_handler<void_(cmLocalGenerator_&,_const_cmListFileBacktrace_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmFLTKWrapUICommand.cxx:134:5)>
         ::_M_manager;
    local_110._0_8_ = (code *)0x0;
    local_110._8_8_ = (pointer)0x0;
    local_1f8._M_allocated_capacity = 0;
    local_1f8._8_8_ = (char *)0x0;
    local_208._M_p = (pointer)0x0;
    pbStack_200 = (pointer)0x0;
    local_1e8._M_p = (pointer)0x0;
    local_228._M_unused._0_8_ = (undefined8)paVar10;
    local_120._0_8_ = paVar10;
    cmMakefile::AddGeneratorAction(this,(GeneratorAction *)&local_228);
    uVar14 = local_90;
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
              ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&local_1e8);
    if ((code *)local_1f8._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_1f8._M_allocated_capacity)(&local_208,&local_208,3);
    }
    if ((cmMakefile *)local_218._0_8_ != (cmMakefile *)0x0) {
      (*(code *)local_218._0_8_)(&local_228,&local_228,3);
    }
    if ((code *)local_110._0_8_ != (code *)0x0) {
      (*(code *)local_110._0_8_)(local_120,local_120,3);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,
                      (ulong)(local_198.field_2._M_allocated_capacity + 1));
    }
    if ((pointer)local_250._0_8_ != local_100) {
      operator_delete((void *)local_250._0_8_,CONCAT71(local_250._17_7_,local_250[0x10]) + 1);
    }
    if ((undefined8 *)local_158._M_allocated_capacity != (undefined8 *)0x0) {
      operator_delete((void *)local_158._M_allocated_capacity,(long)local_148._M_p - local_158._0_8_
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_allocated_capacity != &local_168) {
      operator_delete((void *)local_178._M_allocated_capacity,local_168._M_allocated_capacity + 1);
    }
    uVar9 = local_140;
    if (local_140 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_138 + 8)) goto LAB_001c7755;
  }
  operator_delete((void *)uVar9,
                  (ulong)((long)&(((cmMakefile *)local_138._8_8_)->FindPackageRootPathStack).
                                 super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 ._M_impl.super__Deque_impl_data + 1));
LAB_001c7755:
  return 0x20 < uVar14;
}

Assistant:

bool cmFLTKWrapUICommand(std::vector<std::string> const& args,
                         cmExecutionStatus& status)
{
  if (args.size() < 2) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  cmMakefile& mf = status.GetMakefile();

  // what is the current source dir
  std::string cdir = mf.GetCurrentSourceDirectory();
  std::string const& fluid_exe =
    mf.GetRequiredDefinition("FLTK_FLUID_EXECUTABLE");

  // Target that will use the generated files
  std::string const& target = args[0];

  // get the list of GUI files from which .cxx and .h will be generated
  std::string outputDirectory = mf.GetCurrentBinaryDirectory();

  {
    // Some of the generated files are *.h so the directory "GUI"
    // where they are created have to be added to the include path
    std::vector<std::string> outputDirectories;
    outputDirectories.push_back(outputDirectory);
    mf.AddIncludeDirectories(outputDirectories);
  }

  // List of produced files.
  std::vector<cmSourceFile*> generatedSourcesClasses;

  for (std::string const& arg : cmMakeRange(args).advance(1)) {
    cmSourceFile* curr = mf.GetSource(arg);
    // if we should use the source GUI
    // to generate .cxx and .h files
    if (!curr || !curr->GetPropertyAsBool("WRAP_EXCLUDE")) {
      std::string outName = cmStrCat(
        outputDirectory, "/", cmSystemTools::GetFilenameWithoutExtension(arg));
      std::string hname = cmStrCat(outName, ".h");
      std::string origname = cmStrCat(cdir, "/", arg);
      // add starting depends
      std::vector<std::string> depends;
      depends.push_back(origname);
      depends.push_back(fluid_exe);
      std::string cxxres = cmStrCat(outName, ".cxx");

      cmCustomCommandLines commandLines = cmMakeSingleCommandLine({
        fluid_exe,
        "-c", // instructs Fluid to run in command line
        "-h", // optionally rename .h files
        hname,
        "-o", // optionally rename .cxx files
        cxxres,
        origname // name of the GUI fluid file
      });

      // Add command for generating the .h and .cxx files

      auto hcc = cm::make_unique<cmCustomCommand>();
      hcc->SetDepends(depends);
      hcc->SetCommandLines(commandLines);
      auto ccc = cm::make_unique<cmCustomCommand>(*hcc);

      hcc->SetOutputs(cxxres);
      mf.AddCustomCommandToOutput(std::move(hcc));

      ccc->SetOutputs(hname);
      mf.AddCustomCommandToOutput(std::move(ccc));

      cmSourceFile* sf = mf.GetSource(cxxres);
      sf->AddDepend(hname);
      sf->AddDepend(origname);
      generatedSourcesClasses.push_back(sf);
    }
  }

  // create the variable with the list of sources in it
  size_t lastHeadersClass = generatedSourcesClasses.size();
  std::string sourceListValue;
  for (size_t classNum = 0; classNum < lastHeadersClass; classNum++) {
    if (classNum) {
      sourceListValue += ";";
    }
    sourceListValue += generatedSourcesClasses[classNum]->ResolveFullPath();
  }

  std::string const varName = target + "_FLTK_UI_SRCS";
  mf.AddDefinition(varName, sourceListValue);

  mf.AddGeneratorAction(
    [target](cmLocalGenerator& lg, const cmListFileBacktrace& lfbt) {
      FinalAction(*lg.GetMakefile(), target, lfbt);
    });
  return true;
}